

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::hex_writer>
             *this,back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  size_t sVar1;
  iterator begin;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar2;
  unsigned_long *in_RSI;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_RDI;
  char *in_stack_ffffffffffffffb8;
  hex_writer *this_00;
  char *in_stack_ffffffffffffffd8;
  unsigned_long in_stack_ffffffffffffffe0;
  type in_stack_ffffffffffffffe8;
  
  sVar1 = basic_string_view<char>::size
                    ((basic_string_view<char> *)
                     &((in_RDI.container)->super__List_base<char,_std::allocator<char>_>)._M_impl.
                      _M_node.super__List_node_base._M_prev);
  if (sVar1 != 0) {
    begin = basic_string_view<char>::begin
                      ((basic_string_view<char> *)
                       &((in_RDI.container)->super__List_base<char,_std::allocator<char>_>)._M_impl.
                        _M_node.super__List_node_base._M_prev);
    basic_string_view<char>::end
              ((basic_string_view<char> *)
               &((in_RDI.container)->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node.
                super__List_node_base._M_prev);
    in_stack_ffffffffffffffe0 = *in_RSI;
    in_stack_ffffffffffffffe8 =
         internal::
         copy_str<char,char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                   (begin,in_stack_ffffffffffffffb8,in_RDI);
    *in_RSI = (unsigned_long)in_stack_ffffffffffffffe8.container;
  }
  this_00 = (hex_writer *)*in_RSI;
  bVar2 = std::
          fill_n<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long,char>
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                     in_stack_ffffffffffffffe8.container,in_stack_ffffffffffffffe0,
                     in_stack_ffffffffffffffd8);
  *in_RSI = (unsigned_long)bVar2.container;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
            (this_00,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)
                     in_RDI.container);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }